

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_ghetto_bind(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_RDI;
  char arg [4608];
  AFFECT_DATA af;
  int chance;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed70;
  undefined4 in_stack_ffffffffffffed74;
  undefined4 in_stack_ffffffffffffed78;
  int in_stack_ffffffffffffed7c;
  CHAR_DATA *in_stack_ffffffffffffed80;
  int in_stack_ffffffffffffed9c;
  CHAR_DATA *in_stack_ffffffffffffeda0;
  int in_stack_ffffffffffffee44;
  undefined1 in_stack_ffffffffffffee4b;
  int in_stack_ffffffffffffee4c;
  CHAR_DATA *in_stack_ffffffffffffee50;
  int in_stack_ffffffffffffee6c;
  CHAR_DATA *in_stack_ffffffffffffee70;
  char *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  int local_1c;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
               (char *)in_stack_ffffffffffffed68);
  bVar1 = is_npc(in_stack_ffffffffffffed68);
  if (!bVar1) {
    local_1c = get_skill(in_stack_ffffffffffffee70,in_stack_ffffffffffffee6c);
    if (local_1c == 0) {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    else if ((char)in_stack_ffffffffffffed78 == '\0') {
      send_to_char((char *)in_stack_ffffffffffffed80,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
    }
    else {
      ch_00 = get_char_room(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (ch_00 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffed80,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      }
      else if (ch_00 == in_RDI) {
        send_to_char((char *)in_stack_ffffffffffffed80,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      }
      else if (ch_00->position == 4) {
        bVar1 = is_affected(ch_00,(int)gsn_bind);
        if (bVar1) {
          send_to_char((char *)in_stack_ffffffffffffed80,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
        }
        else {
          bVar1 = is_affected(ch_00,0x15);
          if (bVar1) {
            local_1c = local_1c + -0x1e;
          }
          bVar1 = is_affected(in_RDI,0x15);
          if (bVar1) {
            local_1c = local_1c + 0x1e;
          }
          iVar2 = get_curr_stat(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed9c);
          iVar3 = get_curr_stat(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed9c);
          if (iVar3 < iVar2) {
            local_1c = local_1c + -0x14;
          }
          iVar3 = number_percent();
          if (iVar3 < local_1c) {
            init_affect((AFFECT_DATA *)0x75ccb0);
            std::pow<int,int>(0,0x75ccf9);
            affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed70),
                           (AFFECT_DATA *)in_stack_ffffffffffffed68);
            act((char *)in_stack_ffffffffffffed80,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffed70),in_stack_ffffffffffffed68,0);
            act((char *)in_stack_ffffffffffffed80,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffed70),in_stack_ffffffffffffed68,0);
            act((char *)in_stack_ffffffffffffed80,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffed70),in_stack_ffffffffffffed68,0);
            WAIT_STATE(in_stack_ffffffffffffed80,in_stack_ffffffffffffed7c);
            check_improve(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,
                          (bool)in_stack_ffffffffffffee4b,in_stack_ffffffffffffee44);
          }
          else {
            init_affect((AFFECT_DATA *)0x75cdeb);
            affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed70),
                           (AFFECT_DATA *)in_stack_ffffffffffffed68);
            act((char *)in_stack_ffffffffffffed80,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffed70),in_stack_ffffffffffffed68,0);
            send_to_char((char *)in_stack_ffffffffffffed80,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78))
            ;
            act((char *)in_stack_ffffffffffffed80,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffed70),in_stack_ffffffffffffed68,0);
            WAIT_STATE(in_stack_ffffffffffffed80,in_stack_ffffffffffffed7c);
            check_improve(in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,
                          (bool)in_stack_ffffffffffffee4b,in_stack_ffffffffffffee44);
          }
        }
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffed80,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78));
      }
    }
  }
  return;
}

Assistant:

void do_ghetto_bind(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int chance;
	AFFECT_DATA af;
	char arg[MAX_INPUT_LENGTH];

	one_argument(argument, arg);

	if (is_npc(ch))
		return;

	chance = get_skill(ch, gsn_bind);

	if (chance == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Attempt to bind who?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	if (victim->position != POS_SLEEPING)
	{
		send_to_char("They must be sleeping for you to bind them.\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_bind))
	{
		send_to_char("They are already bound.\n\r", ch);
		return;
	}

	if (is_affected(victim, AFF_HASTE))
		chance -= 30;

	if (is_affected(ch, AFF_HASTE))
		chance += 30;

	if (get_curr_stat(victim, STAT_DEX) > get_curr_stat(ch, STAT_DEX))
		chance -= 20;

	if (number_percent() < chance)
	{
		af.aftype = AFT_SKILL;

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_bind;
		af.level = ch->level;
		af.duration = -1;

		SET_BIT(af.bitvector, AFF_BLIND);
		af.modifier = -5;
		af.location = APPLY_DEX;
		affect_to_char(victim, &af);

		act("$n puts a sack over $N's head and ties a rope around $S legs tightly.", ch, 0, victim, TO_NOTVICT);
		act("You feel someone putting something over your head and legs.", ch, 0, victim, TO_VICT);
		act("You put a sack over $N's head and tie a rope around $S legs tightly.", ch, 0, victim, TO_CHAR);

		WAIT_STATE(ch, PULSE_VIOLENCE);
		check_improve(ch, gsn_bind, true, 1);
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_bind;
		af.level = ch->level;
		af.duration = 3;
		af.modifier = 0;
		af.location = APPLY_NONE;
		affect_to_char(victim, &af);

		act("$n tries to put a sack over $N's head but it rips.", ch, 0, victim, TO_NOTVICT);
		send_to_char("You feel someone trying to put something over your head and legs.\n\r", victim);

		act("You try to put a sack over $N's head but it rips.", ch, 0, victim, TO_CHAR);

		WAIT_STATE(ch, PULSE_VIOLENCE * 3);
		check_improve(ch, gsn_bind, false, 3);
	}
}